

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void init_tree(log_multi *d)

{
  node local_70;
  
  init_node();
  v_array<node>::push_back(&d->nodes,&local_70);
  d->nbofswaps = 0;
  return;
}

Assistant:

void init_tree(log_multi& d)
{
  d.nodes.push_back(init_node());
  d.nbofswaps = 0;
}